

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this)

{
  ImGuiMouseCursorData *local_d8;
  ImVector<ImDrawList_*> *local_b0;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImVec2 local_24 [2];
  ImGuiContext *local_10;
  ImGuiContext *this_local;
  
  local_10 = this;
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  ImVec2::ImVec2(&this->FontTexUvWhitePixel);
  ImVector<ImGuiWindow_*>::ImVector(&this->Windows);
  ImVector<ImGuiWindow_*>::ImVector(&this->WindowsSortBuffer);
  ImVector<ImGuiWindow_*>::ImVector(&this->CurrentWindowStack);
  ImVec2::ImVec2(&this->ActiveIdClickOffset);
  ImVector<ImGuiIniData>::ImVector(&this->Settings);
  ImVector<ImGuiColMod>::ImVector(&this->ColorModifiers);
  ImVector<ImGuiStyleMod>::ImVector(&this->StyleModifiers);
  ImVector<ImFont_*>::ImVector(&this->FontStack);
  ImVector<ImGuiPopupRef>::ImVector(&this->OpenPopupStack);
  ImVector<ImGuiPopupRef>::ImVector(&this->CurrentPopupStack);
  ImVec2::ImVec2(&this->SetNextWindowPosVal);
  ImVec2::ImVec2(&this->SetNextWindowSizeVal);
  ImVec2::ImVec2(&this->SetNextWindowContentSizeVal);
  ImRect::ImRect(&this->SetNextWindowSizeConstraintRect);
  ImDrawData::ImDrawData(&this->RenderDrawData);
  local_b0 = this->RenderDrawLists;
  do {
    ImVector<ImDrawList_*>::ImVector(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (ImVector<ImDrawList_*> *)&this->ModalWindowDarkeningRatio);
  ImDrawList::ImDrawList(&this->OverlayDrawList);
  local_d8 = this->MouseCursorData;
  do {
    ImGuiMouseCursorData::ImGuiMouseCursorData(local_d8);
    local_d8 = local_d8 + 1;
  } while ((ImGuiTextEditState *)local_d8 != &this->InputTextState);
  ImGuiTextEditState::ImGuiTextEditState(&this->InputTextState);
  ImFont::ImFont(&this->InputTextPasswordFont);
  ImGuiStorage::ImGuiStorage(&this->ColorEditModeStorage);
  ImVec2::ImVec2(&this->DragLastMouseDelta);
  ImVec2::ImVec2(&this->ScrollbarClickDeltaToGrabCenter);
  ImVec2::ImVec2(&this->OsImePosRequest);
  ImVec2::ImVec2(&this->OsImePosSet);
  this->Initialized = false;
  this->Font = (ImFont *)0x0;
  this->FontBaseSize = 0.0;
  this->FontSize = 0.0;
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->FontTexUvWhitePixel = local_24[0];
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountRendered = -1;
  this->FrameCountEnded = -1;
  this->CurrentWindow = (ImGuiWindow *)0x0;
  this->FocusedWindow = (ImGuiWindow *)0x0;
  this->HoveredWindow = (ImGuiWindow *)0x0;
  this->HoveredRootWindow = (ImGuiWindow *)0x0;
  this->HoveredId = 0;
  this->HoveredIdAllowOverlap = false;
  this->HoveredIdPreviousFrame = 0;
  this->ActiveId = 0;
  this->ActiveIdPreviousFrame = 0;
  this->ActiveIdIsAlive = false;
  this->ActiveIdIsJustActivated = false;
  this->ActiveIdAllowOverlap = false;
  ImVec2::ImVec2(&local_2c,-1.0,-1.0);
  this->ActiveIdClickOffset = local_2c;
  this->ActiveIdWindow = (ImGuiWindow *)0x0;
  this->MovedWindow = (ImGuiWindow *)0x0;
  this->MovedWindowMoveId = 0;
  this->SettingsDirtyTimer = 0.0;
  ImVec2::ImVec2(&local_34,0.0,0.0);
  this->SetNextWindowPosVal = local_34;
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  this->SetNextWindowSizeVal = local_3c;
  this->SetNextWindowCollapsedVal = false;
  this->SetNextWindowPosCond = 0;
  this->SetNextWindowSizeCond = 0;
  this->SetNextWindowContentSizeCond = 0;
  this->SetNextWindowCollapsedCond = 0;
  this->SetNextWindowFocus = false;
  this->SetNextWindowSizeConstraintCallback = (ImGuiSizeConstraintCallback)0x0;
  this->SetNextWindowSizeConstraintCallbackUserData = (void *)0x0;
  this->SetNextTreeNodeOpenVal = false;
  this->SetNextTreeNodeOpenCond = 0;
  this->ScalarAsInputTextId = 0;
  this->DragCurrentValue = 0.0;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  this->DragLastMouseDelta = local_44;
  this->DragSpeedDefaultRatio = 0.01;
  this->DragSpeedScaleSlow = 0.01;
  this->DragSpeedScaleFast = 10.0;
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  this->ScrollbarClickDeltaToGrabCenter = local_4c;
  memset(this->Tooltip,0,0x400);
  this->PrivateClipboard = (char *)0x0;
  ImVec2::ImVec2(&local_54,-1.0,-1.0);
  this->OsImePosSet = local_54;
  this->OsImePosRequest = this->OsImePosSet;
  this->ModalWindowDarkeningRatio = 0.0;
  (this->OverlayDrawList)._OwnerName = "##Overlay";
  this->MouseCursor = 0;
  memset(this->MouseCursorData,0,0x16c);
  this->LogEnabled = false;
  this->LogFile = (FILE *)0x0;
  this->LogClipboard = (ImGuiTextBuffer *)0x0;
  this->LogStartDepth = 0;
  this->LogAutoExpandMaxDepth = 2;
  memset(this->FramerateSecPerFrame,0,0x28);
  this->FramerateSecPerFrameIdx = 0;
  this->FramerateSecPerFrameAccum = 0.0;
  this->CaptureKeyboardNextFrame = -1;
  this->CaptureMouseNextFrame = -1;
  memset(this->TempBuffer,0,0xc01);
  return;
}

Assistant:

ImGuiContext()
    {
        Initialized = false;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        FontTexUvWhitePixel = ImVec2(0.0f, 0.0f);

        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        CurrentWindow = NULL;
        FocusedWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredId = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdPreviousFrame = 0;
        ActiveId = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdIsAlive = false;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdClickOffset = ImVec2(-1,-1);
        ActiveIdWindow = NULL;
        MovedWindow = NULL;
        MovedWindowMoveId = 0;
        SettingsDirtyTimer = 0.0f;

        SetNextWindowPosVal = ImVec2(0.0f, 0.0f);
        SetNextWindowSizeVal = ImVec2(0.0f, 0.0f);
        SetNextWindowCollapsedVal = false;
        SetNextWindowPosCond = 0;
        SetNextWindowSizeCond = 0;
        SetNextWindowContentSizeCond = 0;
        SetNextWindowCollapsedCond = 0;
        SetNextWindowFocus = false;
        SetNextWindowSizeConstraintCallback = NULL;
        SetNextWindowSizeConstraintCallbackUserData = NULL;
        SetNextTreeNodeOpenVal = false;
        SetNextTreeNodeOpenCond = 0;

        ScalarAsInputTextId = 0;
        DragCurrentValue = 0.0f;
        DragLastMouseDelta = ImVec2(0.0f, 0.0f);
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        DragSpeedScaleSlow = 0.01f;
        DragSpeedScaleFast = 10.0f;
        ScrollbarClickDeltaToGrabCenter = ImVec2(0.0f, 0.0f);
        memset(Tooltip, 0, sizeof(Tooltip));
        PrivateClipboard = NULL;
        OsImePosRequest = OsImePosSet = ImVec2(-1.0f, -1.0f);

        ModalWindowDarkeningRatio = 0.0f;
        OverlayDrawList._OwnerName = "##Overlay"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;
        memset(MouseCursorData, 0, sizeof(MouseCursorData));

        LogEnabled = false;
        LogFile = NULL;
        LogClipboard = NULL;
        LogStartDepth = 0;
        LogAutoExpandMaxDepth = 2;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        CaptureMouseNextFrame = CaptureKeyboardNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }